

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O3

Hop_Man_t * Hop_ManStart(void)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  Hop_Man_t *p;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Hop_Obj_t **ppHVar6;
  Hop_Obj_t *pHVar7;
  
  p = (Hop_Man_t *)calloc(1,0xb8);
  p->nTravIds = 1;
  p->fRefCount = 1;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  p->vPis = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  p->vPos = pVVar4;
  Hop_ManStartMemory(p);
  pHVar7 = p->pListFree;
  if (pHVar7 == (Hop_Obj_t *)0x0) {
    Hop_ManAddMemory(p);
    pHVar7 = p->pListFree;
  }
  p->pListFree = (Hop_Obj_t *)pHVar7->field_0;
  pHVar7->pFanin0 = (Hop_Obj_t *)0x0;
  pHVar7->pFanin1 = (Hop_Obj_t *)0x0;
  (pHVar7->field_0).pData = (void *)0x0;
  (pHVar7->field_1).pNext = (Hop_Obj_t *)0x0;
  *(undefined8 *)&pHVar7->field_0x20 = 0;
  pVVar4 = p->vObjs;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    uVar2 = p->nCreated;
    if (uVar2 != pVVar4->nSize) {
      __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hop.h"
                    ,0xf0,"Hop_Obj_t *Hop_ManFetchMemory(Hop_Man_t *)");
    }
    if (uVar2 == pVVar4->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = 0x10;
      }
      else {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar5 = pVVar4->pArray;
    }
    iVar3 = pVVar4->nSize;
    pVVar4->nSize = iVar3 + 1;
    ppvVar5[iVar3] = pHVar7;
  }
  iVar3 = p->nCreated;
  p->nCreated = iVar3 + 1;
  pHVar7->Id = iVar3;
  p->pConst1 = pHVar7;
  *(uint *)&pHVar7->field_0x20 = (*(uint *)&pHVar7->field_0x20 & 0xfffffff8) + 1;
  puVar1 = &p->pConst1->field_0x20;
  *(uint *)puVar1 = *(uint *)puVar1 | 8;
  p->nCreated = 1;
  p->nTableSize = 0x2717;
  ppHVar6 = (Hop_Obj_t **)calloc(1,0x138b8);
  p->pTable = ppHVar6;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Hop_Man_t * Hop_ManStart()
{
    Hop_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Hop_Man_t, 1 );
    memset( p, 0, sizeof(Hop_Man_t) );
    // perform initializations
    p->nTravIds = 1;
    p->fRefCount = 1;
    p->fCatchExor = 0;
    // allocate arrays for nodes
    p->vPis = Vec_PtrAlloc( 100 );
    p->vPos = Vec_PtrAlloc( 100 );
    // prepare the internal memory manager
    Hop_ManStartMemory( p );
    // create the constant node
    p->pConst1 = Hop_ManFetchMemory( p );
    p->pConst1->Type = AIG_CONST1;
    p->pConst1->fPhase = 1;
    p->nCreated = 1;
    // start the table
//    p->nTableSize = 107;
    p->nTableSize = 10007;
    p->pTable = ABC_ALLOC( Hop_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Hop_Obj_t *) * p->nTableSize );
    return p;
}